

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

Token slang::parsing::Lexer::stringify
                (Lexer *parentLexer,Token startToken,
                span<slang::parsing::Token,_18446744073709551615UL> bodyTokens,Token endToken)

{
  Token *pTVar1;
  BumpAllocator *pBVar2;
  SourceManager *sourceManager;
  undefined2 uVar3;
  undefined1 uVar4;
  undefined1 uVar6;
  undefined4 uVar8;
  short sVar9;
  bool bVar10;
  int iVar11;
  undefined4 extraout_var;
  SourceLocation SVar12;
  undefined4 extraout_var_00;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX;
  Info *extraout_RDX_00;
  EVP_PKEY_CTX *ctx;
  long lVar13;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar14;
  basic_string_view<char,_std::char_traits<char>_> bVar15;
  Token TVar16;
  string_view source;
  bool tripleQuoted;
  string_view raw;
  SmallVector<char,_40UL> text;
  Token startToken_local;
  Token token;
  anon_class_16_2_0e293a20 addTrivia;
  Diagnostics unused;
  LexerOptions local_358;
  Lexer lexer;
  undefined6 uVar5;
  undefined5 uVar7;
  char *startPtr;
  
  startToken_local.info = startToken.info;
  text.super_SmallVectorBase<char>.data_ = text.super_SmallVectorBase<char>.firstElement;
  text.super_SmallVectorBase<char>.len = 0;
  text.super_SmallVectorBase<char>.cap = 0x28;
  lexer.alloc._0_1_ = 0x22;
  startToken_local._0_8_ = startToken._0_8_;
  SmallVectorBase<char>::emplace_back<char>(&text.super_SmallVectorBase<char>,(char *)&lexer);
  tripleQuoted = (startToken._0_8_ & 0xffff) == 0x15b;
  if (tripleQuoted) {
    lexer.alloc._0_1_ = 0x22;
    SmallVectorBase<char>::emplace_back<char>(&text.super_SmallVectorBase<char>,(char *)&lexer);
    lexer.alloc._0_1_ = 0x22;
    SmallVectorBase<char>::emplace_back<char>(&text.super_SmallVectorBase<char>,(char *)&lexer);
  }
  addTrivia.tripleQuoted = &tripleQuoted;
  addTrivia.text = &text;
  for (lVar13 = 0; bodyTokens._M_extent._M_extent_value._M_extent_value << 4 != lVar13;
      lVar13 = lVar13 + 0x10) {
    pTVar1 = (Token *)((long)&(bodyTokens._M_ptr)->kind + lVar13);
    uVar3 = pTVar1->kind;
    uVar4 = pTVar1->field_0x2;
    uVar6 = pTVar1->numFlags;
    uVar8 = pTVar1->rawLen;
    uVar7 = CONCAT41(uVar8,uVar6);
    uVar5 = CONCAT51(uVar7,uVar4);
    lexer.diagnostics = (Diagnostics *)pTVar1->info;
    lexer.alloc._0_1_ = (undefined1)uVar3;
    lexer.alloc._1_1_ = (undefined1)((ushort)uVar3 >> 8);
    lexer.alloc._2_6_ = uVar5;
    stringify::anon_class_16_2_0e293a20::operator()(&addTrivia,*pTVar1);
    sVar9 = CONCAT11(lexer.alloc._1_1_,lexer.alloc._0_1_);
    if (sVar9 == 4) {
      unused.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.
      _0_16_ = Token::rawText((Token *)&lexer);
      bVar15._M_str = "\"\"\"";
      bVar15._M_len = 3;
      bVar10 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                         ((basic_string_view<char,_std::char_traits<char>_> *)&unused,bVar15);
      if (bVar10) {
        raw._M_len = 6;
        raw._M_str = "\\\"\\\"\\\"";
        SmallVectorBase<char>::append_range<std::basic_string_view<char,_std::char_traits<char>_>_>
                  (&text.super_SmallVectorBase<char>,&raw);
        unused.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.
        _0_16_ = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)&unused,3,
                            (size_type)
                            ((long)&unused.super_SmallVector<slang::Diagnostic,_2UL>.
                                    super_SmallVectorBase<slang::Diagnostic>.data_[-1].symbol + 2));
      }
      else {
        raw._M_len = 2;
        raw._M_str = "\\\"";
        SmallVectorBase<char>::append_range<std::basic_string_view<char,_std::char_traits<char>_>_>
                  (&text.super_SmallVectorBase<char>,&raw);
        unused.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.
        _0_16_ = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)&unused,1,
                            (size_type)
                            ((long)&unused.super_SmallVector<slang::Diagnostic,_2UL>.
                                    super_SmallVectorBase<slang::Diagnostic>.data_[-1].symbol + 6));
      }
      SmallVectorBase<char>::append_range<std::basic_string_view<char,_std::char_traits<char>_>_>
                (&text.super_SmallVectorBase<char>,
                 (basic_string_view<char,_std::char_traits<char>_> *)&unused);
      if (bVar10) {
        raw._M_len = 6;
        raw._M_str = "\\\"\\\"\\\"";
        SmallVectorBase<char>::append_range<std::basic_string_view<char,_std::char_traits<char>_>_>
                  (&text.super_SmallVectorBase<char>,&raw);
      }
      else {
        raw._M_len = 2;
        raw._M_str = "\\\"";
        SmallVectorBase<char>::append_range<std::basic_string_view<char,_std::char_traits<char>_>_>
                  (&text.super_SmallVectorBase<char>,&raw);
      }
    }
    else if (sVar9 != 0x15e) {
      if (sVar9 == 0x15c) {
        unused.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.
        data_._0_1_ = 0x5c;
        SmallVectorBase<char>::emplace_back<char>(&text.super_SmallVectorBase<char>,(char *)&unused)
        ;
        unused.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.
        data_._0_1_ = 0x22;
        SmallVectorBase<char>::emplace_back<char>(&text.super_SmallVectorBase<char>,(char *)&unused)
        ;
      }
      else {
        unused.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.
        _0_16_ = Token::rawText((Token *)&lexer);
        SmallVectorBase<char>::append_range<std::basic_string_view<char,_std::char_traits<char>_>_>
                  (&text.super_SmallVectorBase<char>,
                   (basic_string_view<char,_std::char_traits<char>_> *)&unused);
      }
    }
  }
  if (endToken.info != (Info *)0x0) {
    stringify::anon_class_16_2_0e293a20::operator()(&addTrivia,endToken);
  }
  if (tripleQuoted == true) {
    lexer.alloc._0_1_ = 0x22;
    SmallVectorBase<char>::emplace_back<char>(&text.super_SmallVectorBase<char>,(char *)&lexer);
    lexer.alloc._0_1_ = 0x22;
    SmallVectorBase<char>::emplace_back<char>(&text.super_SmallVectorBase<char>,(char *)&lexer);
  }
  lexer.alloc._0_1_ = 0x22;
  SmallVectorBase<char>::emplace_back<char>(&text.super_SmallVectorBase<char>,(char *)&lexer);
  lexer.alloc._0_1_ = 0;
  SmallVectorBase<char>::emplace_back<char>(&text.super_SmallVectorBase<char>,(char *)&lexer);
  iVar11 = SmallVectorBase<char>::copy
                     (&text.super_SmallVectorBase<char>,(EVP_PKEY_CTX *)parentLexer->alloc,src);
  startPtr = (char *)CONCAT44(extraout_var,iVar11);
  unused.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.len = 0;
  unused.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)unused.super_SmallVector<slang::Diagnostic,_2UL>.
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  unused.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  pBVar2 = parentLexer->alloc;
  sourceManager = parentLexer->sourceManager;
  raw._M_len = extraout_RDX;
  raw._M_str = startPtr;
  LexerOptions::LexerOptions(&local_358,&parentLexer->options);
  source._M_str = startPtr;
  source._M_len = extraout_RDX;
  Lexer(&lexer,(BufferID)0xffffffff,source,startPtr,pBVar2,&unused,sourceManager,&local_358);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                 *)&local_358);
  token = lex(&lexer);
  pBVar2 = parentLexer->alloc;
  sVar14 = Token::trivia(&startToken_local);
  bVar15 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&raw,0,raw._M_len - 1);
  SVar12 = Token::location(&startToken_local);
  TVar16._0_4_ = Token::clone(&token,(__fn *)pBVar2,sVar14._M_ptr,
                              (int)sVar14._M_extent._M_extent_value,(void *)bVar15._M_len,
                              bVar15._M_str,SVar12);
  TVar16.rawLen = extraout_var_00;
  ctx = (EVP_PKEY_CTX *)0x292a4a;
  ~Lexer(&lexer);
  SmallVectorBase<slang::Diagnostic>::cleanup((SmallVectorBase<slang::Diagnostic> *)&unused,ctx);
  SmallVectorBase<char>::cleanup(&text.super_SmallVectorBase<char>,ctx);
  TVar16.info = extraout_RDX_00;
  return TVar16;
}

Assistant:

Token Lexer::stringify(Lexer& parentLexer, Token startToken, std::span<Token> bodyTokens,
                       Token endToken) {
    SmallVector<char> text;
    text.push_back('"');

    const bool tripleQuoted = startToken.kind == TokenKind::MacroTripleQuote;
    if (tripleQuoted) {
        text.push_back('"');
        text.push_back('"');
    }

    auto addTrivia = [&](Token cur) {
        for (const Trivia& t : cur.trivia()) {
            if (t.kind == TriviaKind::Whitespace ||
                (tripleQuoted && t.kind == TriviaKind::EndOfLine)) {
                text.append_range(t.getRawText());
            }
        }
    };

    for (auto cur : bodyTokens) {
        addTrivia(cur);

        if (cur.kind == TokenKind::MacroEscapedQuote) {
            text.push_back('\\');
            text.push_back('"');
        }
        else if (cur.kind == TokenKind::StringLiteral) {
            auto raw = cur.rawText();
            const bool nestedHasTriple = raw.starts_with("\"\"\""sv);
            if (nestedHasTriple) {
                text.append_range(R"(\"\"\")"sv);
                raw = raw.substr(3, raw.size() - 6);
            }
            else {
                text.append_range(R"(\")"sv);
                raw = raw.substr(1, raw.size() - 2);
            }

            text.append_range(raw);

            if (nestedHasTriple)
                text.append_range(R"(\"\"\")"sv);
            else
                text.append_range(R"(\")"sv);
        }
        else if (cur.kind != TokenKind::EmptyMacroArgument) {
            text.append_range(cur.rawText());
        }
    }

    if (endToken)
        addTrivia(endToken);

    if (tripleQuoted) {
        text.push_back('"');
        text.push_back('"');
    }

    text.push_back('"');
    text.push_back('\0');

    std::string_view raw = toStringView(text.copy(parentLexer.alloc));

    Diagnostics unused;
    Lexer lexer{BufferID::getPlaceholder(), raw,    raw.data(),
                parentLexer.alloc,          unused, parentLexer.sourceManager,
                parentLexer.options};

    auto token = lexer.lex();
    SLANG_ASSERT(token.kind == TokenKind::StringLiteral);
    SLANG_ASSERT(lexer.lex().kind == TokenKind::EndOfFile);

    return token.clone(parentLexer.alloc, startToken.trivia(), raw.substr(0, raw.length() - 1),
                       startToken.location());
}